

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O0

_Bool plutovg_matrix_invert(plutovg_matrix_t *matrix,plutovg_matrix_t *inverse)

{
  float fVar1;
  float f;
  float e;
  float d;
  float c;
  float b;
  float a;
  float inv_det;
  float det;
  plutovg_matrix_t *inverse_local;
  plutovg_matrix_t *matrix_local;
  
  fVar1 = matrix->a * matrix->d + -(matrix->b * matrix->c);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    if (inverse != (plutovg_matrix_t *)0x0) {
      fVar1 = 1.0 / fVar1;
      plutovg_matrix_init(inverse,matrix->d * fVar1,-(matrix->b * fVar1),-(matrix->c * fVar1),
                          matrix->a * fVar1,
                          (matrix->c * matrix->f + -(matrix->d * matrix->e)) * fVar1,
                          (matrix->b * matrix->e + -(matrix->a * matrix->f)) * fVar1);
    }
    matrix_local._7_1_ = true;
  }
  else {
    matrix_local._7_1_ = false;
  }
  return matrix_local._7_1_;
}

Assistant:

bool plutovg_matrix_invert(const plutovg_matrix_t* matrix, plutovg_matrix_t* inverse)
{
    float det = (matrix->a * matrix->d - matrix->b * matrix->c);
    if(det == 0.f)
        return false;
    if(inverse) {
        float inv_det = 1.f / det;
        float a = matrix->a * inv_det;
        float b = matrix->b * inv_det;
        float c = matrix->c * inv_det;
        float d = matrix->d * inv_det;
        float e = (matrix->c * matrix->f - matrix->d * matrix->e) * inv_det;
        float f = (matrix->b * matrix->e - matrix->a * matrix->f) * inv_det;
        plutovg_matrix_init(inverse, d, -b, -c, a, e, f);
    }

    return true;
}